

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::OverlappingExtensionRangeTest_ExtensionRangeInternal_Test::
~OverlappingExtensionRangeTest_ExtensionRangeInternal_Test
          (OverlappingExtensionRangeTest_ExtensionRangeInternal_Test *this)

{
  OverlappingExtensionRangeTest_ExtensionRangeInternal_Test *this_local;
  
  ~OverlappingExtensionRangeTest_ExtensionRangeInternal_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OverlappingExtensionRangeTest, ExtensionRangeInternal) {
  // Build descriptors for the following definitions:
  //
  //   message Foo {
  //     extensions 10 to 19;
  //     extensions 15;
  //   }
  FileDescriptorProto foo_file;
  foo_file.set_name("foo.proto");

  DescriptorProto* foo = AddMessage(&foo_file, "Foo");
  AddExtensionRange(foo, 10, 20);
  AddExtensionRange(foo, 15, 16);

  DescriptorPool pool;
  MockErrorCollector error_collector;
  // The extensions ranges are invalid, so the proto shouldn't build.
  ASSERT_TRUE(pool.BuildFileCollectingErrors(foo_file, &error_collector) ==
              nullptr);
  ASSERT_EQ(
      "foo.proto: Foo: NUMBER: Extension range 15 to 15 overlaps with "
      "already-defined range 10 to 19.\n",
      error_collector.text_);
}